

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O1

mip_level * __thiscall crnlib::mip_level::operator=(mip_level *this,mip_level *rhs)

{
  image<crnlib::color_quad<unsigned_char,_int>_> *other;
  dxt_image *other_00;
  image<crnlib::color_quad<unsigned_char,_int>_> *this_00;
  dxt_image *this_01;
  
  clear(this);
  this->m_width = rhs->m_width;
  this->m_height = rhs->m_height;
  this->m_comp_flags = rhs->m_comp_flags;
  this->m_format = rhs->m_format;
  this->m_orient_flags = rhs->m_orient_flags;
  other = rhs->m_pImage;
  if (other != (image<crnlib::color_quad<unsigned_char,_int>_> *)0x0) {
    this_00 = (image<crnlib::color_quad<unsigned_char,_int>_> *)crnlib_malloc(0x30);
    image<crnlib::color_quad<unsigned_char,_int>_>::image(this_00,other);
    this->m_pImage = this_00;
  }
  other_00 = rhs->m_pDXTImage;
  if (other_00 != (dxt_image *)0x0) {
    this_01 = (dxt_image *)crnlib_malloc(0x48);
    dxt_image::dxt_image(this_01,other_00);
    this->m_pDXTImage = this_01;
  }
  return this;
}

Assistant:

mip_level& mip_level::operator=(const mip_level& rhs) {
  clear();

  m_width = rhs.m_width;
  m_height = rhs.m_height;
  m_comp_flags = rhs.m_comp_flags;
  m_format = rhs.m_format;
  m_orient_flags = rhs.m_orient_flags;

  if (rhs.m_pImage)
    m_pImage = crnlib_new<image_u8>(*rhs.m_pImage);

  if (rhs.m_pDXTImage)
    m_pDXTImage = crnlib_new<dxt_image>(*rhs.m_pDXTImage);

  return *this;
}